

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CaptureSourceAndGroups
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Recycler *recycler,Program *program,
          EncodedChar *body,CharCount bodyChars,CharCount bodyEncodedChars)

{
  char16 *buffer;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Recycler *this_00;
  DecodeOptions options;
  char16_t *pcVar7;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  data._32_8_ = this;
  if ((program->source).ptr != (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfa,"(program->source == 0)","program->source == 0");
    if (!bVar3) goto LAB_00ec0022;
    *puVar6 = 0;
  }
  if (body == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xbfb,"(body != 0)","body != 0");
    if (!bVar3) goto LAB_00ec0022;
    *puVar6 = 0;
  }
  local_70 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_a7d0a61;
  data.filename._0_4_ = 0xbfe;
  data.plusSize = (ulong)(bodyChars + 1);
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
  if (bodyChars == 0xffffffff) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pcVar7 = (char16_t *)&DAT_00000008;
  }
  else {
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00ec0022;
      *puVar6 = 0;
    }
    pcVar7 = (char16_t *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                       (this_00,(ulong)(bodyChars + 1) * 2);
    if (pcVar7 == (char16_t *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00ec0022;
      *puVar6 = 0;
      pcVar7 = (char16_t *)0x0;
    }
  }
  Memory::Recycler::WBSetBit((char *)program);
  (program->source).ptr = pcVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(program);
  uVar2 = data._32_8_;
  buffer = (program->source).ptr;
  options = *(DecodeOptions *)(data._32_8_ + 8) & ~doSecondSurrogatePair;
  *(DecodeOptions *)(data._32_8_ + 8) = options;
  local_70 = (undefined1  [8])body;
  utf8::DecodeUnitsInto(buffer,(LPCUTF8 *)local_70,body + bodyEncodedChars,options,(bool *)0x0);
  (program->source).ptr[bodyChars] = L'\0';
  program->sourceLen = bodyChars;
  iVar5 = *(int *)(uVar2 + 0x54);
  if (iVar5 < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc07,"(nextGroupId > 0)","nextGroupId > 0");
    if (!bVar3) {
LAB_00ec0022:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
    iVar5 = *(int *)(uVar2 + 0x54);
  }
  if (iVar5 < 0x8000) {
    program->numGroups = (Type)iVar5;
    return;
  }
  Js::JavascriptError::ThrowRangeError(*(ScriptContext **)(uVar2 + 0x10),-0x7ff5e9d5,(PCWSTR)0x0);
}

Assistant:

void Parser<P, IsLiteral>::CaptureSourceAndGroups(Recycler* recycler, Program* program, const EncodedChar* body, CharCount bodyChars, CharCount bodyEncodedChars)
    {
        Assert(program->source == 0);
        Assert(body != 0);

        // Program will own source string
        program->source = RecyclerNewArrayLeaf(recycler, Char, bodyChars + 1);
        // Don't need to zero out since we're writing to the buffer right here
        this->ConvertToUnicode(program->source, bodyChars, body, body + bodyEncodedChars);

        program->source[bodyChars] = 0;
        program->sourceLen = bodyChars;

        // We expect nextGroupId to be positive, because the full regexp itself always
        // counts as a capturing group.
        Assert(nextGroupId > 0);
        if (nextGroupId > MAX_NUM_GROUPS)
        {
            Js::JavascriptError::ThrowRangeError(this->scriptContext, JSERR_RegExpTooManyCapturingGroups);
        }
        else
        {
            program->numGroups = static_cast<uint16>(nextGroupId);
        }

        // Remaining to set during compilation: litbuf, litbufLen, numLoops, insts, instsLen, entryPointLabel
    }